

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_write_server_hello(mbedtls_ssl_context *ssl)

{
  long lVar1;
  size_t sVar2;
  time_t ssl_00;
  int iVar3;
  time_t tVar4;
  undefined1 *puVar5;
  long lVar6;
  char *pcVar7;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar8;
  undefined1 *local_50;
  uchar *p;
  uchar *buf;
  size_t n;
  size_t ext_len;
  size_t olen;
  time_t tStack_20;
  int ret;
  time_t t;
  mbedtls_ssl_context *ssl_local;
  
  uVar8 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  t = (time_t)ssl;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
             ,0x845,"=> write server hello");
  if (((*(uint *)(*(long *)t + 0x164) >> 1 & 1) == 1) &&
     (*(char *)(*(long *)(t + 0x60) + 0x3c0) != '\0')) {
    mbedtls_debug_print_msg
              ((mbedtls_ssl_context *)t,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x84b,"client hello was not authenticated");
    mbedtls_debug_print_msg
              ((mbedtls_ssl_context *)t,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x84c,"<= write server hello");
    ssl_local._4_4_ = ssl_write_hello_verify_request((mbedtls_ssl_context *)t);
  }
  else if (*(long *)(*(long *)t + 0x30) == 0) {
    mbedtls_debug_print_msg
              ((mbedtls_ssl_context *)t,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x854,"no RNG provided");
    ssl_local._4_4_ = -0x7400;
  }
  else {
    lVar1 = *(long *)(t + 0x148);
    mbedtls_ssl_write_version
              (*(int *)(t + 0x14),*(int *)(t + 0x18),*(uint *)(*(long *)t + 0x164) >> 1 & 1,
               (uchar *)(lVar1 + 4));
    mbedtls_debug_print_msg
              ((mbedtls_ssl_context *)t,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x867,"server hello, chosen version: [%d:%d]",(ulong)*(byte *)(lVar1 + 4),
               CONCAT44(uVar8,(uint)*(byte *)(lVar1 + 5)));
    tStack_20 = time((time_t *)0x0);
    *(char *)(lVar1 + 6) = (char)((ulong)tStack_20 >> 0x18);
    *(char *)(lVar1 + 7) = (char)((ulong)tStack_20 >> 0x10);
    *(char *)(lVar1 + 8) = (char)((ulong)tStack_20 >> 8);
    *(char *)(lVar1 + 9) = (char)tStack_20;
    mbedtls_debug_print_msg
              ((mbedtls_ssl_context *)t,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x870,"server hello, current time: %lu",tStack_20);
    olen._4_4_ = (**(code **)(*(long *)t + 0x30))
                           (*(undefined8 *)(*(long *)t + 0x38),lVar1 + 10,0x1c);
    ssl_local._4_4_ = olen._4_4_;
    if (olen._4_4_ == 0) {
      lVar6 = *(long *)(t + 0x60);
      *(undefined8 *)(lVar6 + 0x640) = *(undefined8 *)(lVar1 + 6);
      *(undefined8 *)(lVar6 + 0x648) = *(undefined8 *)(lVar1 + 0xe);
      *(undefined8 *)(lVar6 + 0x650) = *(undefined8 *)(lVar1 + 0x16);
      *(undefined8 *)(lVar6 + 0x658) = *(undefined8 *)(lVar1 + 0x1e);
      mbedtls_debug_print_buf
                ((mbedtls_ssl_context *)t,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x87f,"server hello, random bytes",(uchar *)(lVar1 + 6),0x20);
      if ((((*(int *)(*(long *)(t + 0x60) + 0xa84) == 0) && (*(int *)(t + 0xc) == 0)) &&
          (*(long *)(*(long *)(t + 0x58) + 0x10) != 0)) &&
         ((*(long *)(*(long *)t + 0x40) != 0 &&
          (iVar3 = (**(code **)(*(long *)t + 0x40))(*(undefined8 *)(*(long *)t + 0x50)), iVar3 == 0)
          ))) {
        mbedtls_debug_print_msg
                  ((mbedtls_ssl_context *)t,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0x88e,"session successfully restored from cache");
        *(undefined4 *)(*(long *)(t + 0x60) + 0xa84) = 1;
      }
      if (*(int *)(*(long *)(t + 0x60) + 0xa84) == 0) {
        *(int *)(t + 8) = *(int *)(t + 8) + 1;
        tVar4 = time((time_t *)0x0);
        **(time_t **)(t + 0x58) = tVar4;
        if (*(int *)(*(long *)(t + 0x60) + 0xa94) == 0) {
          buf = (uchar *)0x20;
          *(undefined8 *)(*(long *)(t + 0x58) + 0x10) = 0x20;
          iVar3 = (**(code **)(*(long *)t + 0x30))
                            (*(undefined8 *)(*(long *)t + 0x38),*(long *)(t + 0x58) + 0x18,0x20);
          if (iVar3 != 0) {
            return iVar3;
          }
          olen._4_4_ = 0;
        }
        else {
          buf = (uchar *)0x0;
          *(undefined8 *)(*(long *)(t + 0x58) + 0x10) = 0;
          memset((void *)(*(long *)(t + 0x58) + 0x18),0,0x20);
        }
      }
      else {
        buf = *(uchar **)(*(long *)(t + 0x58) + 0x10);
        *(undefined4 *)(t + 8) = 0xc;
        olen._4_4_ = mbedtls_ssl_derive_keys((mbedtls_ssl_context *)t);
        if (olen._4_4_ != 0) {
          mbedtls_debug_print_ret
                    ((mbedtls_ssl_context *)t,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                     ,0x8b7,"mbedtls_ssl_derive_keys",olen._4_4_);
          return olen._4_4_;
        }
        olen._4_4_ = 0;
      }
      *(char *)(lVar1 + 0x26) = (char)*(undefined8 *)(*(long *)(t + 0x58) + 0x10);
      memcpy((void *)(lVar1 + 0x27),(void *)(*(long *)(t + 0x58) + 0x18),
             *(size_t *)(*(long *)(t + 0x58) + 0x10));
      puVar5 = (undefined1 *)(*(long *)(*(long *)(t + 0x58) + 0x10) + lVar1 + 0x27);
      mbedtls_debug_print_msg
                ((mbedtls_ssl_context *)t,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x8c8,"server hello, session id len.: %d",buf);
      mbedtls_debug_print_buf
                ((mbedtls_ssl_context *)t,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x8c9,"server hello, session id",(uchar *)(lVar1 + 0x27),(size_t)buf);
      pcVar7 = "no";
      if (*(int *)(*(long *)(t + 0x60) + 0xa84) != 0) {
        pcVar7 = "a";
      }
      mbedtls_debug_print_msg
                ((mbedtls_ssl_context *)t,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x8cb,"%s session has been resumed",pcVar7);
      ssl_00 = t;
      *puVar5 = (char)((uint)*(undefined4 *)(*(long *)(t + 0x58) + 8) >> 8);
      puVar5[1] = (char)*(undefined4 *)(*(long *)(t + 0x58) + 8);
      local_50 = puVar5 + 3;
      puVar5[2] = (char)*(undefined4 *)(*(long *)(t + 0x58) + 0xc);
      pcVar7 = mbedtls_ssl_get_ciphersuite_name(*(int *)(*(long *)(t + 0x58) + 8));
      mbedtls_debug_print_msg
                ((mbedtls_ssl_context *)ssl_00,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x8d2,"server hello, chosen ciphersuite: %s",pcVar7);
      mbedtls_debug_print_msg
                ((mbedtls_ssl_context *)t,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x8d4,"server hello, compress alg.: 0x%02X",
                 (ulong)*(uint *)(*(long *)(t + 0x58) + 0xc));
      ssl_write_renegotiation_ext((mbedtls_ssl_context *)t,puVar5 + 5,&ext_len);
      sVar2 = ext_len;
      ssl_write_max_fragment_length_ext((mbedtls_ssl_context *)t,puVar5 + ext_len + 5,&ext_len);
      lVar6 = ext_len + sVar2;
      ssl_write_truncated_hmac_ext((mbedtls_ssl_context *)t,puVar5 + lVar6 + 5,&ext_len);
      lVar6 = ext_len + lVar6;
      ssl_write_encrypt_then_mac_ext((mbedtls_ssl_context *)t,puVar5 + lVar6 + 5,&ext_len);
      lVar6 = ext_len + lVar6;
      ssl_write_extended_ms_ext((mbedtls_ssl_context *)t,puVar5 + lVar6 + 5,&ext_len);
      lVar6 = ext_len + lVar6;
      ssl_write_session_ticket_ext((mbedtls_ssl_context *)t,puVar5 + lVar6 + 5,&ext_len);
      lVar6 = ext_len + lVar6;
      ssl_write_supported_point_formats_ext((mbedtls_ssl_context *)t,puVar5 + lVar6 + 5,&ext_len);
      lVar6 = ext_len + lVar6;
      ssl_write_alpn_ext((mbedtls_ssl_context *)t,puVar5 + lVar6 + 5,&ext_len);
      lVar6 = ext_len + lVar6;
      mbedtls_debug_print_msg
                ((mbedtls_ssl_context *)t,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x8ff,"server hello, total extension length: %d",lVar6);
      if (lVar6 != 0) {
        *local_50 = (char)((ulong)lVar6 >> 8);
        puVar5[4] = (char)lVar6;
        local_50 = puVar5 + lVar6 + 5;
      }
      *(long *)(t + 0x158) = (long)local_50 - lVar1;
      *(undefined4 *)(t + 0x150) = 0x16;
      **(undefined1 **)(t + 0x148) = 2;
      olen._4_4_ = mbedtls_ssl_write_record((mbedtls_ssl_context *)t);
      mbedtls_debug_print_msg
                ((mbedtls_ssl_context *)t,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x90e,"<= write server hello");
      ssl_local._4_4_ = olen._4_4_;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_write_server_hello( mbedtls_ssl_context *ssl )
{
#if defined(MBEDTLS_HAVE_TIME)
    time_t t;
#endif
    int ret;
    size_t olen, ext_len = 0, n;
    unsigned char *buf, *p;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write server hello" ) );

#if defined(MBEDTLS_SSL_DTLS_HELLO_VERIFY)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake->verify_cookie_len != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "client hello was not authenticated" ) );
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write server hello" ) );

        return( ssl_write_hello_verify_request( ssl ) );
    }
#endif /* MBEDTLS_SSL_DTLS_HELLO_VERIFY */

    if( ssl->conf->f_rng == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "no RNG provided") );
        return( MBEDTLS_ERR_SSL_NO_RNG );
    }

    /*
     *     0  .   0   handshake type
     *     1  .   3   handshake length
     *     4  .   5   protocol version
     *     6  .   9   UNIX time()
     *    10  .  37   random bytes
     */
    buf = ssl->out_msg;
    p = buf + 4;

    mbedtls_ssl_write_version( ssl->major_ver, ssl->minor_ver,
                       ssl->conf->transport, p );
    p += 2;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, chosen version: [%d:%d]",
                        buf[4], buf[5] ) );

#if defined(MBEDTLS_HAVE_TIME)
    t = time( NULL );
    *p++ = (unsigned char)( t >> 24 );
    *p++ = (unsigned char)( t >> 16 );
    *p++ = (unsigned char)( t >>  8 );
    *p++ = (unsigned char)( t       );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, current time: %lu", t ) );
#else
    if( ( ret = ssl->conf->f_rng( ssl->conf->p_rng, p, 4 ) ) != 0 )
        return( ret );

    p += 4;
#endif /* MBEDTLS_HAVE_TIME */

    if( ( ret = ssl->conf->f_rng( ssl->conf->p_rng, p, 28 ) ) != 0 )
        return( ret );

    p += 28;

    memcpy( ssl->handshake->randbytes + 32, buf + 6, 32 );

    MBEDTLS_SSL_DEBUG_BUF( 3, "server hello, random bytes", buf + 6, 32 );

    /*
     * Resume is 0  by default, see ssl_handshake_init().
     * It may be already set to 1 by ssl_parse_session_ticket_ext().
     * If not, try looking up session ID in our cache.
     */
    if( ssl->handshake->resume == 0 &&
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        ssl->renego_status == MBEDTLS_SSL_INITIAL_HANDSHAKE &&
#endif
        ssl->session_negotiate->id_len != 0 &&
        ssl->conf->f_get_cache != NULL &&
        ssl->conf->f_get_cache( ssl->conf->p_cache, ssl->session_negotiate ) == 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "session successfully restored from cache" ) );
        ssl->handshake->resume = 1;
    }

    if( ssl->handshake->resume == 0 )
    {
        /*
         * New session, create a new session id,
         * unless we're about to issue a session ticket
         */
        ssl->state++;

#if defined(MBEDTLS_HAVE_TIME)
        ssl->session_negotiate->start = time( NULL );
#endif

#if defined(MBEDTLS_SSL_SESSION_TICKETS)
        if( ssl->handshake->new_session_ticket != 0 )
        {
            ssl->session_negotiate->id_len = n = 0;
            memset( ssl->session_negotiate->id, 0, 32 );
        }
        else
#endif /* MBEDTLS_SSL_SESSION_TICKETS */
        {
            ssl->session_negotiate->id_len = n = 32;
            if( ( ret = ssl->conf->f_rng( ssl->conf->p_rng, ssl->session_negotiate->id,
                                    n ) ) != 0 )
                return( ret );
        }
    }
    else
    {
        /*
         * Resuming a session
         */
        n = ssl->session_negotiate->id_len;
        ssl->state = MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC;

        if( ( ret = mbedtls_ssl_derive_keys( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_derive_keys", ret );
            return( ret );
        }
    }

    /*
     *    38  .  38     session id length
     *    39  . 38+n    session id
     *   39+n . 40+n    chosen ciphersuite
     *   41+n . 41+n    chosen compression alg.
     *   42+n . 43+n    extensions length
     *   44+n . 43+n+m  extensions
     */
    *p++ = (unsigned char) ssl->session_negotiate->id_len;
    memcpy( p, ssl->session_negotiate->id, ssl->session_negotiate->id_len );
    p += ssl->session_negotiate->id_len;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, session id len.: %d", n ) );
    MBEDTLS_SSL_DEBUG_BUF( 3,   "server hello, session id", buf + 39, n );
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "%s session has been resumed",
                   ssl->handshake->resume ? "a" : "no" ) );

    *p++ = (unsigned char)( ssl->session_negotiate->ciphersuite >> 8 );
    *p++ = (unsigned char)( ssl->session_negotiate->ciphersuite      );
    *p++ = (unsigned char)( ssl->session_negotiate->compression      );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, chosen ciphersuite: %s",
           mbedtls_ssl_get_ciphersuite_name( ssl->session_negotiate->ciphersuite ) ) );
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, compress alg.: 0x%02X",
                   ssl->session_negotiate->compression ) );

    /*
     *  First write extensions, then the total length
     */
    ssl_write_renegotiation_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;

#if defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH)
    ssl_write_max_fragment_length_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_SSL_TRUNCATED_HMAC)
    ssl_write_truncated_hmac_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_SSL_ENCRYPT_THEN_MAC)
    ssl_write_encrypt_then_mac_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_SSL_EXTENDED_MASTER_SECRET)
    ssl_write_extended_ms_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_SSL_SESSION_TICKETS)
    ssl_write_session_ticket_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_ECDH_C) || defined(MBEDTLS_ECDSA_C)
    ssl_write_supported_point_formats_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

#if defined(MBEDTLS_SSL_ALPN)
    ssl_write_alpn_ext( ssl, p + 2 + ext_len, &olen );
    ext_len += olen;
#endif

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, total extension length: %d", ext_len ) );

    if( ext_len > 0 )
    {
        *p++ = (unsigned char)( ( ext_len >> 8 ) & 0xFF );
        *p++ = (unsigned char)( ( ext_len      ) & 0xFF );
        p += ext_len;
    }

    ssl->out_msglen  = p - buf;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_SERVER_HELLO;

    ret = mbedtls_ssl_write_record( ssl );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write server hello" ) );

    return( ret );
}